

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

int Ses_ManCreateTruthTableClause(Ses_Man_t *pSes,int t)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  int iVar4;
  int pLits [3];
  
  iVar1 = pSes->nGates;
  if (0 < iVar1) {
    i = 0;
    do {
      iVar1 = pSes->nSpecVars + i;
      if (iVar1 != 0 && SCARRY4(pSes->nSpecVars,i) == iVar1 < 0) {
        iVar1 = 0;
        do {
          iVar2 = iVar1 + 1;
          iVar4 = iVar2;
          if (iVar2 < pSes->nSpecVars + i) {
            do {
              Ses_ManCreateMainClause(pSes,t,i,iVar1,iVar4,0,0,1);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,iVar4,0,1,0);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,iVar4,0,1,1);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,iVar4,1,0,0);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,iVar4,1,0,1);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,iVar4,1,1,0);
              Ses_ManCreateMainClause(pSes,t,i,iVar1,iVar4,1,1,1);
              iVar4 = iVar4 + 1;
            } while (iVar4 < pSes->nSpecVars + i);
          }
          iVar1 = iVar2;
        } while (iVar2 < pSes->nSpecVars + i);
      }
      if ((pSes->nSpecFunc != 1) && (0 < pSes->nSpecFunc)) {
        iVar1 = 0;
        lVar3 = 0;
        do {
          if (pSes->nGates <= i) {
            __assert_fail("i < pSes->nGates",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3d3,"int Ses_ManOutputVar(Ses_Man_t *, int, int)");
          }
          iVar4 = pSes->nGates * (int)lVar3 + i + pSes->nOutputOffset;
          if (iVar4 < 0) goto LAB_002c10a1;
          pLits[0] = iVar4 * 2 + 1;
          if (pSes->nRows <= t) goto LAB_002c10c0;
          iVar4 = pSes->nRows * i + t + pSes->nSimOffset;
          if (iVar4 < 0) goto LAB_002c10a1;
          pLits[1] = (uint)((pSes->pSpec[(long)iVar1 + (long)((int)(t + 1U) >> 6)] >>
                             (ulong)(t + 1U & 0x3f) & 1) != 0) + iVar4 * 2 ^ 1;
          iVar4 = sat_solver_addclause(pSes->pSat,pLits,pLits + 2);
          if (iVar4 == 0) {
            return 0;
          }
          lVar3 = lVar3 + 1;
          iVar1 = iVar1 + 4;
        } while (lVar3 < pSes->nSpecFunc);
      }
      i = i + 1;
      iVar1 = pSes->nGates;
    } while (i < iVar1);
  }
  if (pSes->nSpecFunc == 1) {
    if (pSes->nRows <= t) {
LAB_002c10c0:
      __assert_fail("t < pSes->nRows",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                    ,0x3cb,"int Ses_ManSimVar(Ses_Man_t *, int, int)");
    }
    iVar1 = pSes->nRows * (iVar1 + -1) + t + pSes->nSimOffset;
    if (iVar1 < 0) {
LAB_002c10a1:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(pSes->vAssump,
                (uint)((pSes->pSpec[(int)(t + 1U) >> 6] >> ((ulong)(t + 1U) & 0x3f) & 1) != 0) +
                iVar1 * 2 ^ 1);
  }
  return 1;
}

Assistant:

static int inline Ses_ManCreateTruthTableClause( Ses_Man_t * pSes, int t )
{
    int i, j, k, h;
    int pLits[3];

    for ( i = 0; i < pSes->nGates; ++i )
    {
        /* main clauses */
        for ( j = 0; j < pSes->nSpecVars + i; ++j )
            for ( k = j + 1; k < pSes->nSpecVars + i; ++k )
            {
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 0, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 1, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 1, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 0, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 0, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 1, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 1, 1 );
            }

        /* output clauses */
        if ( pSes->nSpecFunc != 1 )
            for ( h = 0; h < pSes->nSpecFunc; ++h )
            {
                pLits[0] = Abc_Var2Lit( Ses_ManOutputVar( pSes, h, i ), 1 );
                pLits[1] = Abc_Var2Lit( Ses_ManSimVar( pSes, i, t ), 1 - Abc_TtGetBit( &pSes->pSpec[h << 2], t + 1 ) );
                if ( !sat_solver_addclause( pSes->pSat, pLits, pLits + 2 ) )
                    return 0;
            }
    }

    if ( pSes->nSpecFunc == 1 )
        Vec_IntPush( pSes->vAssump, Abc_Var2Lit( Ses_ManSimVar( pSes, pSes->nGates - 1, t ), 1 - Abc_TtGetBit( pSes->pSpec, t + 1 ) ) );

    return 1;
}